

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O0

ssize_t readline(archive_read *a,tar *tar,char **start,ssize_t limit,size_t *unconsumed)

{
  void *pvVar1;
  archive_string *paVar2;
  void *local_60;
  void *p;
  char *s;
  void *t;
  ssize_t total_size;
  ssize_t bytes_read;
  size_t *unconsumed_local;
  ssize_t limit_local;
  char **start_local;
  tar *tar_local;
  archive_read *a_local;
  
  t = (void *)0x0;
  bytes_read = (ssize_t)unconsumed;
  unconsumed_local = (size_t *)limit;
  limit_local = (ssize_t)start;
  start_local = (char **)tar;
  tar_local = (tar *)a;
  tar_flush_unconsumed(a,unconsumed);
  s = (char *)__archive_read_ahead((archive_read *)tar_local,1,&total_size);
  if (total_size < 1) {
    a_local = (archive_read *)0xffffffffffffffe2;
  }
  else {
    pvVar1 = memchr(s,10,total_size);
    if (pvVar1 == (void *)0x0) {
      *(ssize_t *)bytes_read = total_size;
      local_60 = (void *)0x0;
      while ((long)t + total_size <= (long)unconsumed_local) {
        paVar2 = archive_string_ensure((archive_string *)(start_local + 0x1e),(long)t + total_size);
        if (paVar2 == (archive_string *)0x0) {
          archive_set_error((archive *)tar_local,0xc,"Can\'t allocate working buffer");
          return -0x1e;
        }
        memcpy(start_local[0x1e] + (long)t,s,total_size);
        tar_flush_unconsumed((archive_read *)tar_local,(size_t *)bytes_read);
        t = (void *)(total_size + (long)t);
        if (local_60 != (void *)0x0) {
          *(char **)limit_local = start_local[0x1e];
          return (ssize_t)t;
        }
        s = (char *)__archive_read_ahead((archive_read *)tar_local,1,&total_size);
        if (total_size < 1) {
          return -0x1e;
        }
        local_60 = memchr(s,10,total_size);
        if (local_60 != (void *)0x0) {
          total_size = (long)local_60 + (1 - (long)s);
        }
        *(ssize_t *)bytes_read = total_size;
      }
      archive_set_error((archive *)tar_local,0x54,"Line too long");
      a_local = (archive_read *)0xffffffffffffffe2;
    }
    else {
      total_size = (long)pvVar1 + (1 - (long)s);
      if ((long)unconsumed_local < total_size) {
        archive_set_error((archive *)tar_local,0x54,"Line too long");
        a_local = (archive_read *)0xffffffffffffffe2;
      }
      else {
        *(ssize_t *)bytes_read = total_size;
        *(char **)limit_local = s;
        a_local = (archive_read *)total_size;
      }
    }
  }
  return (ssize_t)a_local;
}

Assistant:

static ssize_t
readline(struct archive_read *a, struct mtree *mtree, char **start,
    ssize_t limit)
{
	ssize_t bytes_read;
	ssize_t total_size = 0;
	ssize_t find_off = 0;
	const void *t;
	void *nl;
	char *u;

	/* Accumulate line in a line buffer. */
	for (;;) {
		/* Read some more. */
		t = __archive_read_ahead(a, 1, &bytes_read);
		if (t == NULL)
			return (0);
		if (bytes_read < 0)
			return (ARCHIVE_FATAL);
		nl = memchr(t, '\n', bytes_read);
		/* If we found '\n', trim the read to end exactly there. */
		if (nl != NULL) {
			bytes_read = ((const char *)nl) - ((const char *)t) + 1;
		}
		if (total_size + bytes_read + 1 > limit) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Line too long");
			return (ARCHIVE_FATAL);
		}
		if (archive_string_ensure(&mtree->line,
			total_size + bytes_read + 1) == NULL) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate working buffer");
			return (ARCHIVE_FATAL);
		}
		/* Append new bytes to string. */
		memcpy(mtree->line.s + total_size, t, bytes_read);
		__archive_read_consume(a, bytes_read);
		total_size += bytes_read;
		mtree->line.s[total_size] = '\0';

		for (u = mtree->line.s + find_off; *u; ++u) {
			if (u[0] == '\n') {
				/* Ends with unescaped newline. */
				*start = mtree->line.s;
				return total_size;
			} else if (u[0] == '#') {
				/* Ends with comment sequence #...\n */
				if (nl == NULL) {
					/* But we've not found the \n yet */
					break;
				}
			} else if (u[0] == '\\') {
				if (u[1] == '\n') {
					/* Trim escaped newline. */
					total_size -= 2;
					mtree->line.s[total_size] = '\0';
					break;
				} else if (u[1] != '\0') {
					/* Skip the two-char escape sequence */
					++u;
				}
			}
		}
		find_off = u - mtree->line.s;
	}
}